

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 __thiscall djb::tab::h2_to_u2_std(tab *this,vec3 *wm,vec3 *wi)

{
  float_t fVar1;
  float u1_00;
  float fVar2;
  float_t y;
  double dVar3;
  undefined4 extraout_XMM0_Db;
  float local_5c;
  float_t u2;
  float_t u1;
  float_t pm;
  vec3 wm_std;
  vec3 wi_std;
  int s;
  vec3 *wi_local;
  vec3 *wm_local;
  tab *this_local;
  
  vec3::vec3((vec3 *)&wm_std.y,wi->x * 1.0,wi->y * 1.0,wi->z);
  vec3::vec3((vec3 *)&u1,wm->x * 1.0,wm->y * 1.0,wm->z);
  if (1.0 <= wm_std.x) {
    local_5c = 0.0;
  }
  else {
    dVar3 = std::atan2((double)(ulong)(uint)pm,(double)(ulong)(uint)u1);
    local_5c = SUB84(dVar3,0);
  }
  fVar1 = m_pi();
  u1_00 = (local_5c / fVar1 + 1.0) * 0.5;
  fVar2 = sat<float>(&wm_std.x);
  dVar3 = std::acos((double)CONCAT44(extraout_XMM0_Db,fVar2));
  fVar1 = m_pi();
  dVar3 = std::sqrt((double)(ulong)(uint)(SUB84(dVar3,0) * (2.0 / fVar1)));
  fVar1 = cdf1(this,u1_00,(vec3 *)&wm_std.y);
  y = cdf2(this,SUB84(dVar3,0),u1_00,(vec3 *)&wm_std.y);
  vec2::vec2((vec2 *)&this_local,fVar1,y);
  return (vec2)this_local;
}

Assistant:

vec2 tab::h2_to_u2_std(const vec3 &wm, const vec3 &wi) const
{
	int s = 1;//wi.y > 0 ? 1 : -1; // exploit the azimuthal symmetry of the BRDF
	vec3 wi_std = vec3(s * wi.x, s * wi.y, wi.z);
	vec3 wm_std = vec3(s * wm.x, s * wm.y, wm.z);
	float_t pm = wm_std.z < 1 ? atan2(wm_std.y, wm_std.x) : 0;
	float_t u1 = (pm / m_pi() + 1) / 2;
	float_t u2 = sqrt(acos(sat(wm_std.z)) * (2 / m_pi()));

	return vec2(cdf1(u1, wi_std), cdf2(u2, u1, wi_std));
}